

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

int __thiscall jrtplib::RTPSession::SetLocalName(RTPSession *this,void *s,size_t len)

{
  int iVar1;
  
  iVar1 = -0x3e;
  if (((this->created == true) && (iVar1 = -0x32, (this->rtcpbuilder).init == true)) &&
     (iVar1 = -0x37, len < 0x100)) {
    iVar1 = RTCPSDESInfo::SDESItem::SetString
                      ((this->rtcpbuilder).ownsdesinfo.super_RTCPSDESInfo.nonprivateitems + 1,
                       &(this->rtcpbuilder).ownsdesinfo.super_RTCPSDESInfo.nonprivateitems[1].str,
                       &(this->rtcpbuilder).ownsdesinfo.super_RTCPSDESInfo.nonprivateitems[1].length
                       ,(uint8_t *)s,len);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int RTPSession::SetLocalName(const void *s,size_t len)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;
	BUILDER_LOCK
	status = rtcpbuilder.SetLocalName(s,len);
	BUILDER_UNLOCK
	return status;
}